

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessageRecursive<unsigned_long>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,unsigned_long param)

{
  string *in_RDX;
  value_type *in_RDI;
  value_type *this;
  
  this = in_RDI;
  ExceptionFormatValue::CreateFormatValue<unsigned_long>((unsigned_long)in_RDI);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            this,in_RDI);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x29f01b3);
  ConstructMessageRecursive
            (in_RDX,(vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                     *)this);
  return (string *)this;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}